

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_object.cpp
# Opt level: O2

bool __thiscall
mjs::anon_unknown_33::has_own_property(anon_unknown_33 *this,object_ptr *o,wstring_view p)

{
  bool bVar1;
  property_attribute a;
  long *plVar2;
  object_ptr *local_18;
  size_t local_10;
  
  local_10 = p._M_len;
  local_18 = o;
  plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
  a = (**(code **)(*plVar2 + 0x30))(plVar2,&local_18);
  bVar1 = is_valid(a);
  return bVar1;
}

Assistant:

bool has_own_property(const object_ptr& o, const std::wstring_view p) {
    return is_valid(o->own_property_attributes(p));
}